

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR linkblock(LispPTR base)

{
  int iVar1;
  uint uVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  int local_40;
  LispPTR *freeblock;
  LispPTR freeblocklsp;
  LispPTR fbl;
  arrayblock *tmpbase;
  arrayblock *fbbase;
  arrayblock *bbase;
  LispPTR base_local;
  
  if (*FreeBlockBuckets_word != 0) {
    pLVar3 = NativeAligned4FromLAddr(base);
    if ((ushort)*pLVar3 < 4) {
      checkarrayblock(base,1,0);
    }
    else {
      uVar2 = *FreeBlockBuckets_word;
      iVar1 = integerlength((uint)(ushort)*pLVar3);
      if (iVar1 < 0x1f) {
        local_40 = integerlength((uint)(ushort)*pLVar3);
      }
      else {
        local_40 = 0x1e;
      }
      pLVar4 = NativeAligned4FromLAddr((uVar2 & 0xfffffff) + local_40 * 2 & 0xfffffff);
      uVar2 = *pLVar4 & 0xfffffff;
      if (uVar2 == 0) {
        pLVar3[1] = base;
        pLVar3[2] = base;
      }
      else {
        pLVar5 = NativeAligned4FromLAddr(uVar2);
        pLVar3[1] = uVar2;
        pLVar3[2] = pLVar5[2];
        pLVar3 = NativeAligned4FromLAddr(pLVar5[2]);
        pLVar3[1] = base;
        pLVar5[2] = base;
      }
      *pLVar4 = base;
      checkarrayblock(base,1,1);
    }
  }
  return base;
}

Assistant:

LispPTR linkblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *tmpbase;
  LispPTR fbl, freeblocklsp;
  LispPTR *freeblock;
  if (*FreeBlockBuckets_word != NIL) {
    bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
    if (bbase->arlen < MINARRAYBLOCKSIZE)
      checkarrayblock(base, T, NIL);
    else {
      fbl = FreeBlockChainN(bbase->arlen);
      freeblock = (LispPTR *)NativeAligned4FromLAddr(POINTERMASK & fbl);
      freeblocklsp = POINTERMASK & (*freeblock);
      if (freeblocklsp == NIL) {
        bbase->fwd = base;
        bbase->bkwd = base;
      } else {
        fbbase = (struct arrayblock *)NativeAligned4FromLAddr(freeblocklsp);
        bbase->fwd = freeblocklsp;
        bbase->bkwd = fbbase->bkwd;
        tmpbase = (struct arrayblock *)NativeAligned4FromLAddr(fbbase->bkwd);
        tmpbase->fwd = base;
        fbbase->bkwd = base;
      }
      *freeblock = base;
      checkarrayblock(base, T, T);
    }
  }
  return (base);
}